

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_check.c
# Opt level: O3

_Bool ch_checkfunction(ch_context *vm,ch_primitive value,ch_function **actual)

{
  char *error;
  ch_primitive_type cVar1;
  
  cVar1 = value.type;
  if (cVar1 == PRIMITIVE_OBJECT) {
    cVar1 = ((ch_object *)&(value.field_1.object_value)->type)->type;
    if (cVar1 == PRIMITIVE_NUMBER) {
      *actual = (ch_function *)value.field_1;
      return true;
    }
    error = "Expected function type, but got object type %d instead";
  }
  else {
    error = "Expected string type, but got type %d instead";
  }
  ch_runtime_error(vm,EXIT_USER_ERROR,error,(ulong)cVar1);
  return false;
}

Assistant:

bool ch_checkfunction(ch_context* vm, ch_primitive value, ch_function** actual) {
	ch_object* object_value = NULL;
	if(!checkobject(vm, value, &object_value)) return false;

	if (!IS_FUNCTION(object_value)) {
		ch_runtime_error(vm, EXIT_USER_ERROR, "Expected function type, but got object type %d instead", object_value->type);
		return false;
	}

	*actual = AS_FUNCTION(object_value);

	return true;
}